

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCommitPhaseTwo(Btree *p,int bCleanup)

{
  int *piVar1;
  BtShared *pBVar2;
  Pager *pPager;
  uint uVar3;
  code *pcVar4;
  
  if (p->inTrans != '\0') {
    if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
      btreeLockCarefully(p);
    }
    if (p->inTrans == '\x02') {
      pBVar2 = p->pBt;
      pPager = pBVar2->pPager;
      uVar3 = pPager->errCode;
      if (uVar3 == 0) {
        if (((pPager->eState == '\x02') && (pPager->exclusiveMode != '\0')) &&
           (pPager->journalMode == '\x01')) {
          pPager->eState = '\x01';
          uVar3 = 0;
        }
        else {
          pPager->iDataVersion = pPager->iDataVersion + 1;
          uVar3 = pager_end_transaction(pPager,(uint)pPager->setMaster,1);
          if (((char)uVar3 == '\r') || ((uVar3 & 0xff) == 10)) {
            pPager->errCode = uVar3;
            pPager->eState = '\x06';
            if (uVar3 == 0) {
              if (pPager->bUseFetch == '\0') {
                pcVar4 = getPageNormal;
              }
              else {
                pcVar4 = getPageMMap;
              }
            }
            else {
              pcVar4 = getPageError;
            }
            pPager->xGet = pcVar4;
          }
        }
      }
      if (bCleanup == 0 && uVar3 != 0) {
        if (p->sharable != '\0') {
          piVar1 = &p->wantToLock;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            unlockBtreeMutex(p);
          }
        }
      }
      else {
        p->iDataVersion = p->iDataVersion - 1;
        pBVar2->inTransaction = '\x01';
        sqlite3BitvecDestroy(pBVar2->pHasContent);
        pBVar2->pHasContent = (Bitvec *)0x0;
      }
      if (bCleanup == 0 && uVar3 != 0) {
        return uVar3;
      }
    }
    btreeEndTransaction(p);
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(p);
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseTwo(Btree *p, int bCleanup){

  if( p->inTrans==TRANS_NONE ) return SQLITE_OK;
  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the handle has a write-transaction open, commit the shared-btrees 
  ** transaction and set the shared state to TRANS_READ.
  */
  if( p->inTrans==TRANS_WRITE ){
    int rc;
    BtShared *pBt = p->pBt;
    assert( pBt->inTransaction==TRANS_WRITE );
    assert( pBt->nTransaction>0 );
    rc = sqlite3PagerCommitPhaseTwo(pBt->pPager);
    if( rc!=SQLITE_OK && bCleanup==0 ){
      sqlite3BtreeLeave(p);
      return rc;
    }
    p->iDataVersion--;  /* Compensate for pPager->iDataVersion++; */
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}